

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void writeLZ77data(LodePNGBitWriter *writer,uivector *lz77_encoded,HuffmanTree *tree_ll,
                  HuffmanTree *tree_d)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint value;
  uint *puVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  
  if (lz77_encoded->size != 0) {
    sVar6 = 0;
    do {
      uVar1 = lz77_encoded->data[sVar6];
      uVar7 = (ulong)uVar1;
      writeBitsReversed(writer,tree_ll->codes[uVar7],(ulong)tree_ll->lengths[uVar7]);
      if (0x100 < uVar7) {
        puVar4 = lz77_encoded->data;
        lVar5 = sVar6 + 1;
        uVar2 = puVar4[sVar6 + 2];
        uVar3 = DISTANCEEXTRA[uVar2];
        value = puVar4[sVar6 + 3];
        sVar6 = sVar6 + 3;
        writeBits(writer,puVar4[lVar5],(ulong)LENGTHEXTRA[uVar1 - 0x101]);
        writeBitsReversed(writer,tree_d->codes[uVar2],(ulong)tree_d->lengths[uVar2]);
        writeBits(writer,value,(ulong)uVar3);
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != lz77_encoded->size);
  }
  return;
}

Assistant:

static void writeLZ77data(LodePNGBitWriter* writer, const uivector* lz77_encoded,
                          const HuffmanTree* tree_ll, const HuffmanTree* tree_d) {
  size_t i = 0;
  for(i = 0; i != lz77_encoded->size; ++i) {
    unsigned val = lz77_encoded->data[i];
    writeBitsReversed(writer, tree_ll->codes[val], tree_ll->lengths[val]);
    if(val > 256) /*for a length code, 3 more things have to be added*/ {
      unsigned length_index = val - FIRST_LENGTH_CODE_INDEX;
      unsigned n_length_extra_bits = LENGTHEXTRA[length_index];
      unsigned length_extra_bits = lz77_encoded->data[++i];

      unsigned distance_code = lz77_encoded->data[++i];

      unsigned distance_index = distance_code;
      unsigned n_distance_extra_bits = DISTANCEEXTRA[distance_index];
      unsigned distance_extra_bits = lz77_encoded->data[++i];

      writeBits(writer, length_extra_bits, n_length_extra_bits);
      writeBitsReversed(writer, tree_d->codes[distance_code], tree_d->lengths[distance_code]);
      writeBits(writer, distance_extra_bits, n_distance_extra_bits);
    }
  }
}